

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O0

void print_value(MOJOSHADER_effectValue *value,uint indent)

{
  int iVar1;
  uint *puVar2;
  int offset;
  MOJOSHADER_effectSamplerState *state;
  int c;
  int r;
  int i;
  uint indent_local;
  MOJOSHADER_effectValue *value_local;
  
  if (indent != 0) {
    do_indent(indent);
  }
  printf("VALUE: %s -> %s\n",value->name,value->semantic);
  do_indent(indent + 1);
  printf("CLASS: %s\n",print_value::classes[(value->type).parameter_class]);
  do_indent(indent + 1);
  printf("TYPE: %s\n",print_value::types[(value->type).parameter_type]);
  do_indent(indent + 1);
  printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",(ulong)(value->type).rows,
         (ulong)(value->type).columns,(ulong)(value->type).elements);
  do_indent(indent + 1);
  printf("TOTAL VALUES: %d\n",(ulong)value->value_count);
  if (((((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER) ||
       ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
      ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
     (((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
      ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))) {
    do_indent(indent + 1);
    printf("SAMPLER VALUES:\n");
    for (c = 0; (uint)c < value->value_count; c = c + 1) {
      puVar2 = (uint *)((long)(value->field_4).values + (long)c * 0x48);
      do_indent(indent + 2);
      printf("TYPE: %s -> ",print_value::samplerstatetypes[*puVar2]);
      if (*puVar2 == 0xc) {
        printf("%.2f\n",(double)**(float **)(puVar2 + 0x10));
      }
      else {
        printf("%d\n",(ulong)**(uint **)(puVar2 + 0x10));
      }
    }
  }
  else {
    do_indent(indent + 1);
    printf("%s VALUES:\n",print_value::types[(value->type).parameter_type]);
    c = 0;
    do {
      for (state._4_4_ = 0; state._4_4_ < (value->type).rows; state._4_4_ = state._4_4_ + 1) {
        do_indent(indent + 2);
        for (state._0_4_ = 0; (uint)state < (value->type).columns; state._0_4_ = (uint)state + 1) {
          iVar1 = c * (value->type).rows * 4 + state._4_4_ * 4 + (uint)state;
          if ((value->type).parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
            printf(print_value::prints[(value->type).parameter_type],
                   (double)*(float *)((long)(value->field_4).values + (long)iVar1 * 4));
          }
          else {
            printf(print_value::prints[(value->type).parameter_type],
                   (ulong)*(uint *)((long)(value->field_4).values + (long)iVar1 * 4));
          }
        }
        printf("\n");
      }
      c = c + 1;
    } while ((uint)c < (value->type).elements);
  }
  return;
}

Assistant:

static void print_value(const MOJOSHADER_effectValue *value,
                        const unsigned int indent)
{
    int i, r, c;

    INDENT();
    printf("VALUE: %s -> %s\n", value->name, value->semantic);

    static const char *classes[] =
    {
        "SCALAR",
        "VECTOR",
        "ROW-MAJOR MATRIX",
        "COLUMN-MAJOR MATRIX",
        "OBJECT",
        "STRUCT"
    };
    static const char *types[] =
    {
        "VOID",
        "BOOL",
        "INT",
        "FLOAT",
        "STRING",
        "TEXTURE",
        "TEXTURE1D",
        "TEXTURE2D",
        "TEXTURE3D",
        "TEXTURECUBE",
        "SAMPLER",
        "SAMPLER1D",
        "SAMPLER2D",
        "SAMPLER3D",
        "SAMPLERCUBE",
        "PIXELSHADER",
        "VERTEXSHADER",
        "UNSUPPORTED"
    };
    do_indent(indent + 1);
    printf("CLASS: %s\n", classes[value->type.parameter_class]);
    do_indent(indent + 1);
    printf("TYPE: %s\n", types[value->type.parameter_type]);

    do_indent(indent + 1);
    printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",
           value->type.rows, value->type.columns, value->type.elements);
    do_indent(indent + 1);
    printf("TOTAL VALUES: %d\n", value->value_count);

    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
    {
        do_indent(indent + 1);
        printf("SAMPLER VALUES:\n");
        for (i = 0; i < value->value_count; i++)
        {
            MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];

            static const char *samplerstatetypes[] =
            {
                "UNKNOWN0",
                "UNKNOWN1",
                "UNKNOWN2",
                "UNKNOWN3",
                "TEXTURE",
                "ADDRESSU",
                "ADDRESSV",
                "ADDRESSW",
                "BORDERCOLOR",
                "MAGFILTER",
                "MINFILTER",
                "MIPFILTER",
                "MIPMAPLODBIAS",
                "MAXMIPLEVEL",
                "MAXANISOTROPY",
                "SRGBTEXTURE",
                "ELEMENTINDEX",
                "DMAPOFFSET",
            };
            do_indent(indent + 2);
            printf("TYPE: %s -> ", samplerstatetypes[state->type]);

            /* Assuming only one value per state! */
            if (state->type == MOJOSHADER_SAMP_MIPMAPLODBIAS)
            {
                /* float types */
                printf("%.2f\n", *state->value.valuesF);
            } // if
            else
            {
                /* int/enum types */
                printf("%d\n", *state->value.valuesI);
            } // else
        } // for
    } // if
    else
    {
        do_indent(indent + 1);
        printf("%s VALUES:\n", types[value->type.parameter_type]);
        i = 0;
        do
        {
            static const char *prints[] =
            {
                "%X ",
                "%d ",
                "%d ",
                "%.2f ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "%d ",
                "%d ",
                "%X "
            };
            for (r = 0; r < value->type.rows; r++)
            {
                do_indent(indent + 2);
                for (c = 0; c < value->type.columns; c++)
                {
                    const int offset = (i * value->type.rows * 4) + (r * 4) + c;
                    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT)
                        printf(prints[value->type.parameter_type], value->valuesF[offset]);
                    else
                        printf(prints[value->type.parameter_type], value->valuesI[offset]);
                } // for
                printf("\n");
            } // for
        } while (++i < value->type.elements);
    } // else
}